

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::truncSatToUI16x8(Literal *__return_storage_ptr__,Literal *this)

{
  Type *this_00;
  Literal *this_01;
  long lVar1;
  undefined1 local_120 [8];
  LaneArray<8> lanes;
  Literal local_48;
  
  getLanesF16x8((LaneArray<8> *)local_120,this);
  lVar1 = 0;
  this_00 = &lanes._M_elems[7].type;
  do {
    this_01 = (Literal *)(local_120 + lVar1);
    truncSatToUI16(&local_48,this_01);
    Literal((Literal *)this_00,&local_48);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
    ~Literal(&local_48);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xc0);
  Literal(__return_storage_ptr__,(LaneArray<8> *)local_120);
  lVar1 = 0xa8;
  do {
    ~Literal((Literal *)(local_120 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncSatToUI16x8() const {
  return unary<8, &Literal::getLanesF16x8, &Literal::truncSatToUI16>(*this);
}